

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
             int isCreate)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  Rtree *pRtree;
  sqlite3_str *psVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  Mem *pMem;
  i64 iVar12;
  i64 iVar13;
  uint uVar14;
  i64 iVar15;
  uint uVar16;
  ulong uVar17;
  int *piVar18;
  u64 n;
  bool bVar19;
  sqlite3_stmt *p;
  sqlite3_stmt *local_80;
  sqlite3_stmt **local_78 [9];
  
  if (0x67 < argc) {
    pcVar5 = sqlite3_mprintf("%s","Too many columns for an rtree table");
    *pzErr = pcVar5;
    return 1;
  }
  sqlite3_vtab_config(db,1,1);
  sVar6 = strlen(argv[1]);
  sVar7 = strlen(argv[2]);
  n = (long)(int)sVar6 + (long)(int)sVar7 + 0x3ca;
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    pRtree = (Rtree *)sqlite3Malloc(n);
  }
  else {
    pRtree = (Rtree *)0x0;
  }
  if (pRtree == (Rtree *)0x0) {
    return 7;
  }
  memset(pRtree,0,n);
  pRtree->nBusy = 1;
  (pRtree->base).pModule = &rtreeModule;
  pRtree->zDb = (char *)(pRtree + 1);
  pcVar5 = (char *)((long)&pRtree[1].base.pModule + ((long)((sVar6 << 0x20) + 0x100000000) >> 0x20))
  ;
  pRtree->zName = pcVar5;
  pRtree->eCoordType = pAux != (void *)0x0;
  memcpy(pRtree + 1,argv[1],(long)(int)sVar6);
  memcpy(pcVar5,argv[2],(long)(int)sVar7);
  psVar8 = sqlite3_str_new(db);
  sqlite3_str_appendf(psVar8,"CREATE TABLE x(%s",argv[3]);
  bVar19 = 4 < argc;
  if (4 < argc) {
    uVar17 = 5;
    do {
      pcVar5 = argv[uVar17 - 1];
      if (*pcVar5 == '+') {
        pRtree->nAux = pRtree->nAux + '\x01';
        pcVar5 = pcVar5 + 1;
      }
      else {
        if (pRtree->nAux != '\0') break;
        pRtree->nDim2 = pRtree->nDim2 + '\x01';
      }
      sqlite3_str_appendf(psVar8,",%s",pcVar5);
      bVar19 = uVar17 < (uint)argc;
      lVar9 = uVar17 + (5 - (ulong)(uint)argc);
      uVar17 = uVar17 + 1;
    } while (lVar9 != 5);
  }
  sqlite3_str_appendf(psVar8,");");
  pcVar5 = sqlite3_str_finish(psVar8);
  if (pcVar5 == (char *)0x0) {
    iVar3 = 7;
  }
  else {
    if (bVar19) {
      pcVar10 = sqlite3_mprintf("%s","Auxiliary rtree columns must be last");
      iVar3 = 1;
    }
    else {
      iVar3 = sqlite3_declare_vtab(db,pcVar5);
      if (iVar3 == 0) {
        iVar3 = 0;
        goto LAB_001df1fe;
      }
      pcVar10 = sqlite3_errmsg(db);
      pcVar10 = sqlite3_mprintf("%s",pcVar10);
    }
    *pzErr = pcVar10;
  }
LAB_001df1fe:
  sqlite3_free(pcVar5);
  if (iVar3 != 0) goto LAB_001df392;
  bVar1 = pRtree->nDim2;
  pRtree->nDim = bVar1 >> 1;
  if (bVar1 < 2) {
    uVar17 = 2;
LAB_001df231:
    bVar19 = false;
  }
  else {
    if (10 < bVar1) {
      uVar17 = 3;
      goto LAB_001df231;
    }
    bVar19 = (bVar1 & 1) == 0;
    uVar17 = (ulong)(bVar1 & 1);
  }
  if (bVar19) {
    pRtree->nBytesPerCell = bVar1 * '\x04' + '\b';
    if (isCreate == 0) {
      iVar3 = 0;
      pcVar5 = sqlite3_mprintf("SELECT length(data) FROM \'%q\'.\'%q_node\' WHERE nodeno = 1",
                               pRtree->zDb,pRtree->zName);
      iVar4 = getIntFromStmt(db,pcVar5,&pRtree->iNodeSize);
      if (iVar4 == 0) {
        if (pRtree->iNodeSize < 0x1c0) {
          pcVar10 = sqlite3_mprintf("undersize RTree blobs in \"%q_node\"",pRtree->zName);
          *pzErr = pcVar10;
          iVar3 = 0x10b;
        }
      }
      else {
        pcVar10 = sqlite3_errmsg(db);
        pcVar10 = sqlite3_mprintf("%s",pcVar10);
        *pzErr = pcVar10;
        iVar3 = iVar4;
      }
    }
    else {
      local_78[0] = (sqlite3_stmt **)((ulong)local_78[0] & 0xffffffff00000000);
      pcVar5 = sqlite3_mprintf("PRAGMA %Q.page_size",pRtree->zDb);
      iVar3 = getIntFromStmt(db,pcVar5,(int *)local_78);
      if (iVar3 == 0) {
        iVar4 = (uint)pRtree->nBytesPerCell * 0x33 + 4;
        if ((int)local_78[0] + -0x40 <= iVar4) {
          iVar4 = (int)local_78[0] + -0x40;
        }
        pRtree->iNodeSize = iVar4;
      }
      else {
        pcVar10 = sqlite3_errmsg(db);
        pcVar10 = sqlite3_mprintf("%s",pcVar10);
        *pzErr = pcVar10;
      }
    }
    sqlite3_free(pcVar5);
    if (iVar3 != 0) goto LAB_001df392;
    pcVar5 = argv[1];
    pcVar10 = argv[2];
    pRtree->db = db;
    if (isCreate == 0) {
LAB_001df4d2:
      local_78[0] = &pRtree->pWriteNode;
      local_78[1] = &pRtree->pDeleteNode;
      local_78[2] = &pRtree->pReadRowid;
      local_78[3] = &pRtree->pWriteRowid;
      local_78[4] = &pRtree->pDeleteRowid;
      local_78[5] = &pRtree->pReadParent;
      local_78[6] = &pRtree->pWriteParent;
      local_78[7] = &pRtree->pDeleteParent;
      iVar4 = sqlite3_table_column_metadata
                        (db,pRtree->zDb,"sqlite_stat1",(char *)0x0,(char **)0x0,(char **)0x0,
                         (int *)0x0,(int *)0x0,(int *)0x0);
      if (iVar4 == 0) {
        pcVar11 = sqlite3_mprintf("SELECT stat FROM %Q.sqlite_stat1 WHERE tbl = \'%q_rowid\'",
                                  pRtree->zDb,pRtree->zName);
        if (pcVar11 == (char *)0x0) {
          iVar3 = 7;
        }
        else {
          iVar12 = 0;
          iVar3 = sqlite3LockAndPrepare(db,pcVar11,-1,0x80,(Vdbe *)0x0,&local_80,(char **)0x0);
          if (iVar3 == 0) {
            iVar3 = sqlite3_step(local_80);
            if (iVar3 == 100) {
              pMem = columnMem(local_80,0);
              iVar12 = sqlite3VdbeIntValue(pMem);
              columnMallocFailure(local_80);
            }
            else {
              iVar12 = 0;
            }
            iVar3 = sqlite3_finalize(local_80);
          }
          else if (iVar3 != 7) {
            iVar3 = 0;
          }
          if (iVar3 == 0) {
            iVar13 = 100;
            if (100 < iVar12) {
              iVar13 = iVar12;
            }
            iVar15 = 0x100000;
            if (iVar12 != 0) {
              iVar15 = iVar13;
            }
            pRtree->nRowEst = iVar15;
          }
          sqlite3_free(pcVar11);
        }
      }
      else {
        pRtree->nRowEst = 0x100000;
        iVar3 = 0;
        if (iVar4 != 1) {
          iVar3 = iVar4;
        }
      }
      if (iVar3 == 0) {
        piVar18 = &rtreeSqlInit_azSql_rel;
        uVar17 = 0;
        do {
          if ((uVar17 != 3) ||
             (pcVar11 = 
              "INSERT INTO\"%w\".\"%w_rowid\"(rowid,nodeno)VALUES(?1,?2)ON CONFLICT(rowid)DO UPDATE SET nodeno=excluded.nodeno"
             , pRtree->nAux == '\0')) {
            pcVar11 = (char *)((long)&rtreeSqlInit_azSql_rel + (long)*piVar18);
          }
          pcVar11 = sqlite3_mprintf(pcVar11,pcVar5,pcVar10);
          if (pcVar11 == (char *)0x0) {
            iVar3 = 7;
          }
          else {
            iVar3 = sqlite3LockAndPrepare
                              (db,pcVar11,-1,0x85,(Vdbe *)0x0,local_78[uVar17],(char **)0x0);
          }
          sqlite3_free(pcVar11);
          if (6 < uVar17) break;
          uVar17 = uVar17 + 1;
          piVar18 = piVar18 + 1;
        } while (iVar3 == 0);
      }
      if (pRtree->nAux != '\0') {
        pcVar11 = sqlite3_mprintf("SELECT * FROM \"%w\".\"%w_rowid\" WHERE rowid=?1",pcVar5,pcVar10)
        ;
        pRtree->zReadAuxSql = pcVar11;
        iVar3 = 7;
        if (pcVar11 != (char *)0x0) {
          psVar8 = sqlite3_str_new(db);
          sqlite3_str_appendf(psVar8,"UPDATE \"%w\".\"%w_rowid\"SET ",pcVar5,pcVar10);
          if (pRtree->nAux != '\0') {
            uVar16 = 0;
            do {
              if (uVar16 != 0) {
                uVar2 = psVar8->nChar;
                uVar14 = uVar2 + 1;
                if (uVar14 < psVar8->nAlloc) {
                  psVar8->nChar = uVar14;
                  psVar8->zText[uVar2] = ',';
                }
                else {
                  enlargeAndAppend(psVar8,",",1);
                }
              }
              if (uVar16 < pRtree->nAuxNotNull) {
                sqlite3_str_appendf(psVar8,"a%d=coalesce(?%d,a%d)",(ulong)uVar16,(ulong)(uVar16 + 2)
                                   );
              }
              else {
                sqlite3_str_appendf(psVar8,"a%d=?%d",(ulong)uVar16,(ulong)(uVar16 + 2));
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < pRtree->nAux);
          }
          sqlite3_str_appendf(psVar8," WHERE rowid=?1");
          pcVar5 = sqlite3_str_finish(psVar8);
          if (pcVar5 != (char *)0x0) {
            iVar3 = sqlite3LockAndPrepare
                              (db,pcVar5,-1,0x85,(Vdbe *)0x0,&pRtree->pWriteAux,(char **)0x0);
            sqlite3_free(pcVar5);
          }
        }
      }
    }
    else {
      psVar8 = sqlite3_str_new(db);
      sqlite3_str_appendf(psVar8,"CREATE TABLE \"%w\".\"%w_rowid\"(rowid INTEGER PRIMARY KEY,nodeno"
                          ,pcVar5,pcVar10);
      if (pRtree->nAux != '\0') {
        uVar16 = 0;
        do {
          sqlite3_str_appendf(psVar8,",a%d",(ulong)uVar16);
          uVar16 = uVar16 + 1;
        } while (uVar16 < pRtree->nAux);
      }
      bVar19 = false;
      sqlite3_str_appendf(psVar8,
                          ");CREATE TABLE \"%w\".\"%w_node\"(nodeno INTEGER PRIMARY KEY,data);",
                          pcVar5,pcVar10);
      sqlite3_str_appendf(psVar8,
                          "CREATE TABLE \"%w\".\"%w_parent\"(nodeno INTEGER PRIMARY KEY,parentnode);"
                          ,pcVar5,pcVar10);
      sqlite3_str_appendf(psVar8,"INSERT INTO \"%w\".\"%w_node\"VALUES(1,zeroblob(%d))",pcVar5);
      pcVar11 = sqlite3_str_finish(psVar8);
      if (pcVar11 == (char *)0x0) {
        iVar3 = 7;
      }
      else {
        iVar3 = sqlite3_exec(db,pcVar11,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
        sqlite3_free(pcVar11);
        bVar19 = iVar3 == 0;
      }
      if (bVar19) goto LAB_001df4d2;
    }
    if (iVar3 == 0) {
      *ppVtab = &pRtree->base;
      return 0;
    }
    pcVar5 = sqlite3_errmsg(db);
  }
  else {
    pcVar5 = *(char **)(&DAT_00236b10 + uVar17 * 8);
    iVar3 = 0;
  }
  pcVar5 = sqlite3_mprintf("%s",pcVar5);
  *pzErr = pcVar5;
LAB_001df392:
  rtreeRelease(pRtree);
  return iVar3 + (uint)(iVar3 == 0);
}

Assistant:

static int rtreeInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  int nDb;              /* Length of string argv[1] */
  int nName;            /* Length of string argv[2] */
  int eCoordType = (pAux ? RTREE_COORD_INT32 : RTREE_COORD_REAL32);
  sqlite3_str *pSql;
  char *zSql;
  int ii = 4;
  int iErr;

  const char *aErrMsg[] = {
    0,                                                    /* 0 */
    "Wrong number of columns for an rtree table",         /* 1 */
    "Too few columns for an rtree table",                 /* 2 */
    "Too many columns for an rtree table",                /* 3 */
    "Auxiliary rtree columns must be last"                /* 4 */
  };

  assert( RTREE_MAX_AUX_COLUMN<256 ); /* Aux columns counted by a u8 */
  if( argc>RTREE_MAX_AUX_COLUMN+3 ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[3]);
    return SQLITE_ERROR;
  }

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);

  /* Allocate the sqlite3_vtab structure */
  nDb = (int)strlen(argv[1]);
  nName = (int)strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName+2);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName+2);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->eCoordType = (u8)eCoordType;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(%s", argv[3]);
  for(ii=4; ii<argc; ii++){
    if( argv[ii][0]=='+' ){
      pRtree->nAux++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]+1);
    }else if( pRtree->nAux>0 ){
      break;
    }else{
      pRtree->nDim2++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]);
    }
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( ii<argc ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[4]);
    rc = SQLITE_ERROR;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto rtreeInit_fail;
  pRtree->nDim = pRtree->nDim2/2;
  if( pRtree->nDim<1 ){
    iErr = 2;
  }else if( pRtree->nDim2>RTREE_MAX_DIMENSIONS*2 ){
    iErr = 3;
  }else if( pRtree->nDim2 % 2 ){
    iErr = 1;
  }else{
    iErr = 0;
  }
  if( iErr ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[iErr]);
    goto rtreeInit_fail;
  }
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto rtreeInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto rtreeInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

rtreeInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}